

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *assertion_result,
          char *expression_text,char *actual_predicate_value,char *expected_predicate_value)

{
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Message msg;
  
  if (*(undefined8 **)(this + 8) == (undefined8 *)0x0) {
    __s = "";
  }
  else {
    __s = (char *)**(undefined8 **)(this + 8);
  }
  Message::Message((Message *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"Value of: ",10);
  poVar2 = (ostream *)(local_38._M_head_impl + 0x10);
  if (assertion_result == (AssertionResult *)0x0) {
    sVar1 = 6;
    assertion_result = (AssertionResult *)"(null)";
  }
  else {
    sVar1 = strlen(&assertion_result->success_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&assertion_result->success_,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"\n  Actual: ",0xb);
  poVar2 = (ostream *)(local_38._M_head_impl + 0x10);
  if (expression_text == (char *)0x0) {
    sVar1 = 6;
    expression_text = "(null)";
  }
  else {
    sVar1 = strlen(expression_text);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,expression_text,sVar1);
  if (*__s != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10)," (",2);
    poVar2 = (ostream *)(local_38._M_head_impl + 0x10);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"\nExpected: ",0xb);
  poVar2 = (ostream *)(local_38._M_head_impl + 0x10);
  if (actual_predicate_value == (char *)0x0) {
    sVar1 = 6;
    actual_predicate_value = "(null)";
  }
  else {
    sVar1 = strlen(actual_predicate_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,actual_predicate_value,sVar1);
  StringStreamToString(__return_storage_ptr__,local_38._M_head_impl);
  if (local_38._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}